

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

void __thiscall
re2::DFA::RunWorkqOnByte
          (DFA *this,Workq *oldq,Workq *newq,int c,uint flag,bool *ismatch,MatchKind kind)

{
  Inst *this_00;
  bool bVar1;
  int *piVar2;
  ostream *this_01;
  int *piVar3;
  LogMessageFatal local_1b0;
  
  (newq->super_SparseSet).size_ = 0;
  newq->nextmark_ = newq->n_;
  piVar2 = (oldq->super_SparseSet).dense_;
  piVar3 = piVar2;
  do {
    if (piVar3 == piVar2 + (oldq->super_SparseSet).size_) {
      return;
    }
    if (*piVar3 < oldq->n_) {
      this_00 = this->prog_->inst_ + *piVar3;
      switch(this_00->out_opcode_ & 7) {
      case 0:
        LogMessageFatal::LogMessageFatal
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                   0x3a2);
        this_01 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"unhandled opcode: ");
        std::ostream::operator<<(this_01,this_00->out_opcode_ & 7);
        LogMessageFatal::~LogMessageFatal(&local_1b0);
        break;
      case 2:
        bVar1 = Prog::Inst::Matches(this_00,c);
        if (bVar1) {
          AddToQueue(this,newq,this_00->out_opcode_ >> 4,flag);
        }
        break;
      case 5:
        if (((c == 0x100) || (this->prog_->anchor_end_ == false)) &&
           (*ismatch = true, kind == kFirstMatch)) {
          return;
        }
      }
    }
    else {
      if (*ismatch != false) {
        return;
      }
      Workq::mark(newq);
    }
    piVar3 = piVar3 + 1;
    piVar2 = (oldq->super_SparseSet).dense_;
  } while( true );
}

Assistant:

void DFA::RunWorkqOnByte(Workq* oldq, Workq* newq,
                         int c, uint flag, bool* ismatch,
                         Prog::MatchKind kind) {
  if (DEBUG_MODE)
    mutex_.AssertHeld();

  newq->clear();
  for (Workq::iterator i = oldq->begin(); i != oldq->end(); ++i) {
    if (oldq->is_mark(*i)) {
      if (*ismatch)
        return;
      newq->mark();
      continue;
    }
    int id = *i;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstFail:        // never succeeds
      case kInstCapture:     // already followed
      case kInstNop:         // already followed
      case kInstAltMatch:    // already followed
      case kInstEmptyWidth:  // already followed
        break;

      case kInstByteRange:   // can follow if c is in range
        if (ip->Matches(c))
          AddToQueue(newq, ip->out(), flag);
        break;

      case kInstMatch:
        if (prog_->anchor_end() && c != kByteEndText)
          break;
        *ismatch = true;
        if (kind == Prog::kFirstMatch) {
          // Can stop processing work queue since we found a match.
          return;
        }
        break;
    }
  }

  if (DebugDFA)
    fprintf(stderr, "%s on %d[%#x] -> %s [%d]\n", DumpWorkq(oldq).c_str(),
            c, flag, DumpWorkq(newq).c_str(), *ismatch);
}